

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

string * __thiscall
sing::HttpResponse::getFileType_abi_cxx11_(string *__return_storage_ptr__,HttpResponse *this)

{
  long lVar1;
  size_type sVar2;
  const_iterator cVar3;
  allocator<char> local_39;
  string suffix;
  
  lVar1 = std::__cxx11::string::rfind((char)&this->path,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"text/plain",(allocator<char> *)&suffix);
  }
  else {
    std::__cxx11::string::substr((ulong)&suffix,(ulong)&this->path);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(&suffix2Type_abi_cxx11_,&suffix);
    if (sVar2 == 1) {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&suffix2Type_abi_cxx11_._M_t,&suffix);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(cVar3._M_node + 2));
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"text/plain",&local_39);
    }
    std::__cxx11::string::~string((string *)&suffix);
  }
  return __return_storage_ptr__;
}

Assistant:

string HttpResponse::getFileType(){
    string::size_type idx = path.find_last_of('.');
    if(idx == string::npos) {
        return "text/plain";
    }
    string suffix = path.substr(idx);
    if(suffix2Type.count(suffix) == 1) {
        return suffix2Type.find(suffix)->second;
    }
    return "text/plain";
}